

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_UUID_struct> *a)

{
  bool bVar1;
  int iVar2;
  int count;
  ON_UUID uuid;
  uint local_3c;
  ON_UUID local_38;
  
  if (a->m_a != (ON_UUID_struct *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 4);
  }
  a->m_count = 0;
  local_3c = 0;
  bVar1 = ReadInt(this,(ON__INT32 *)&local_3c);
  if (0 < (int)local_3c && bVar1) {
    ON_SimpleArray<ON_UUID_struct>::SetCapacity(a,(ulong)local_3c);
    iVar2 = 0;
    while ((iVar2 < (int)local_3c && (bVar1 != false))) {
      bVar1 = ReadUuid(this,&local_38);
      if (bVar1) {
        ON_SimpleArray<ON_UUID_struct>::Append(a,&local_38);
      }
      iVar2 = iVar2 + 1;
    }
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_UUID>& a )
{
  a.Empty();
  ON_UUID uuid;
  int i, count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadUuid( uuid );
      if ( rc )
        a.Append(uuid);
    }
  }
  return rc;
}